

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

int Of_ManComputeOutputRequired(Of_Man_t *p,int fCleanRefs)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Of_Obj_t *pOVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Jf_Par_t *pJVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pGVar3 = p->pGia;
  iVar1 = pGVar3->nObjs;
  if (0 < (long)iVar1) {
    pOVar4 = p->pObjs;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&pOVar4->Required + lVar9) = 1000000000;
      if (fCleanRefs != 0) {
        *(undefined4 *)((long)&pOVar4->nRefs + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x20;
    } while ((long)iVar1 << 5 != lVar9);
  }
  pVVar5 = pGVar3->vCos;
  lVar9 = (long)pVVar5->nSize;
  if (lVar9 < 1) {
    uVar8 = 0;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      iVar11 = pVVar5->pArray[lVar10];
      if (((long)iVar11 < 0) || (iVar1 <= iVar11)) goto LAB_0073f60b;
      uVar2 = p->pObjs[(int)(iVar11 - (*(uint *)(pGVar3->pObjs + iVar11) & 0x1fffffff))].Delay1;
      if ((int)uVar8 <= (int)uVar2) {
        uVar8 = uVar2;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    if (0 < pVVar5->nSize) {
      piVar6 = pVVar5->pArray;
      lVar10 = 0;
      do {
        iVar11 = piVar6[lVar10];
        if (((long)iVar11 < 0) || (iVar1 <= iVar11)) {
LAB_0073f60b:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        iVar11 = iVar11 - (*(uint *)(pGVar3->pObjs + iVar11) & 0x1fffffff);
        pOVar4 = p->pObjs;
        if ((int)uVar8 < pOVar4[iVar11].Required) {
          pOVar4[iVar11].Required = uVar8;
        }
        if (fCleanRefs != 0) {
          pOVar4[iVar11].nRefs = pOVar4[iVar11].nRefs + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
  }
  pJVar7 = p->pPars;
  if ((pJVar7->Delay != 0) && (pJVar7->Delay < (ulong)uVar8)) {
    puts("Error: Delay violation.");
    pJVar7 = p->pPars;
  }
  pJVar7->Delay = (ulong)uVar8;
  return (int)pJVar7;
}

Assistant:

static inline int Of_ManComputeOutputRequired( Of_Man_t * p, int fCleanRefs )
{
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Of_ObjSetRequired( p, i, ABC_INFINITY );
        if ( fCleanRefs )
            Of_ObjSetRefNum( p, i, 0 );
    }
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, Id) );
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
    {
        Of_ObjUpdateRequired( p, Id, Delay );
        if ( fCleanRefs )
            Of_ObjRefInc( p, Id );
    }
    if ( p->pPars->Delay && p->pPars->Delay < Delay )
        printf( "Error: Delay violation.\n" );
    p->pPars->Delay = Delay;
    return Delay;
}